

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__buffer_loop_downsample(stbir__info *stbir_info)

{
  int iVar1;
  float fVar2;
  int local_34;
  int local_30;
  int out_last_scanline;
  int out_first_scanline;
  float out_center_of_in;
  int max_y;
  int pixel_margin;
  float in_pixels_radius;
  int output_h;
  float scale_ratio;
  int y;
  stbir__info *stbir_info_local;
  
  in_pixels_radius = stbir_info->vertical_scale;
  pixel_margin = stbir_info->output_h;
  _scale_ratio = stbir_info;
  fVar2 = (*stbir__filter_info_table[stbir_info->vertical_filter].support)(in_pixels_radius);
  max_y = (int)(fVar2 / in_pixels_radius);
  out_center_of_in = (float)_scale_ratio->vertical_filter_pixel_margin;
  out_first_scanline = _scale_ratio->input_h + (int)out_center_of_in;
  iVar1 = stbir__use_height_upsampling(_scale_ratio);
  if (iVar1 != 0) {
    __assert_fail("!stbir__use_height_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                  ,0x884,"void stbir__buffer_loop_downsample(stbir__info *)");
  }
  output_h = -(int)out_center_of_in;
  while( true ) {
    if (out_first_scanline <= output_h) {
      stbir__empty_ring_buffer(_scale_ratio,_scale_ratio->output_h);
      return;
    }
    stbir__calculate_sample_range_downsample
              (output_h,(float)max_y,in_pixels_radius,_scale_ratio->vertical_shift,&local_30,
               &local_34,(float *)&out_last_scanline);
    if (_scale_ratio->ring_buffer_num_entries < (local_34 - local_30) + 1) break;
    if ((-1 < local_34) && (local_30 < pixel_margin)) {
      stbir__empty_ring_buffer(_scale_ratio,local_30);
      stbir__decode_and_resample_downsample(_scale_ratio,output_h);
      if (_scale_ratio->ring_buffer_begin_index < 0) {
        stbir__add_empty_ring_buffer_entry(_scale_ratio,local_30);
      }
      while (_scale_ratio->ring_buffer_last_scanline < local_34) {
        stbir__add_empty_ring_buffer_entry(_scale_ratio,_scale_ratio->ring_buffer_last_scanline + 1)
        ;
      }
      stbir__resample_vertical_downsample(_scale_ratio,output_h);
    }
    output_h = output_h + 1;
  }
  __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                ,0x88d,"void stbir__buffer_loop_downsample(stbir__info *)");
}

Assistant:

static void stbir__buffer_loop_downsample(stbir__info* stbir_info)
{
    int y;
    float scale_ratio = stbir_info->vertical_scale;
    int output_h = stbir_info->output_h;
    float in_pixels_radius = stbir__filter_info_table[stbir_info->vertical_filter].support(scale_ratio) / scale_ratio;
    int pixel_margin = stbir_info->vertical_filter_pixel_margin;
    int max_y = stbir_info->input_h + pixel_margin;

    STBIR_ASSERT(!stbir__use_height_upsampling(stbir_info));

    for (y = -pixel_margin; y < max_y; y++)
    {
        float out_center_of_in; // Center of the current out scanline in the in scanline space
        int out_first_scanline, out_last_scanline;

        stbir__calculate_sample_range_downsample(y, in_pixels_radius, scale_ratio, stbir_info->vertical_shift, &out_first_scanline, &out_last_scanline, &out_center_of_in);

        STBIR_ASSERT(out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries);

        if (out_last_scanline < 0 || out_first_scanline >= output_h)
            continue;

        stbir__empty_ring_buffer(stbir_info, out_first_scanline);

        stbir__decode_and_resample_downsample(stbir_info, y);

        // Load in new ones.
        if (stbir_info->ring_buffer_begin_index < 0)
            stbir__add_empty_ring_buffer_entry(stbir_info, out_first_scanline);

        while (out_last_scanline > stbir_info->ring_buffer_last_scanline)
            stbir__add_empty_ring_buffer_entry(stbir_info, stbir_info->ring_buffer_last_scanline + 1);

        // Now the horizontal buffer is ready to write to all ring buffer rows.
        stbir__resample_vertical_downsample(stbir_info, y);
    }

    stbir__empty_ring_buffer(stbir_info, stbir_info->output_h);
}